

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGElementMatch
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define,xmlNodePtr elem)

{
  xmlNs *pxVar1;
  xmlRelaxNGDefinePtr pxVar2;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  int iVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *arg1;
  xmlRelaxNGValidErr err;
  xmlRelaxNGDefinePtr *ppxVar7;
  uint uVar8;
  
  if ((define->name != (xmlChar *)0x0) && (iVar4 = xmlStrEqual(elem->name,define->name), iVar4 == 0)
     ) {
    arg1 = define->name;
    pxVar6 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNAME;
    goto LAB_00183580;
  }
  pxVar6 = define->ns;
  if (pxVar6 == (xmlChar *)0x0) {
    if ((elem->ns == (xmlNs *)0x0) || (arg1 = define->name, arg1 == (xmlChar *)0x0))
    goto LAB_00183537;
LAB_00183530:
    err = XML_RELAXNG_ERR_ELEMEXTRANS;
  }
  else {
    pxVar1 = elem->ns;
    if (*pxVar6 == '\0') {
      if (pxVar1 == (xmlNs *)0x0) goto LAB_00183537;
      arg1 = define->name;
      if (arg1 == (xmlChar *)0x0) {
        arg1 = elem->name;
      }
      goto LAB_00183530;
    }
    if (pxVar1 != (xmlNs *)0x0) {
      iVar4 = xmlStrEqual(pxVar1->href,pxVar6);
      if (iVar4 == 0) {
        arg1 = elem->name;
        pxVar6 = define->ns;
        err = XML_RELAXNG_ERR_ELEMWRONGNS;
        goto LAB_00183580;
      }
LAB_00183537:
      pxVar2 = define->nameClass;
      if (pxVar2 == (xmlRelaxNGDefinePtr)0x0) {
        return 1;
      }
      iVar4 = -1;
      if (pxVar2->type == XML_RELAXNG_CHOICE) {
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = ctxt->flags;
          ctxt->flags = uVar8 | 1;
        }
        ppxVar7 = &pxVar2->nameClass;
        do {
          pxVar3 = *ppxVar7;
          if (pxVar3 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            iVar4 = 0;
            if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
              return 0;
            }
            if (0 < ctxt->errNr) {
              xmlRelaxNGPopErrors(ctxt,0);
            }
            goto LAB_0018362b;
          }
          iVar5 = xmlRelaxNGElementMatch(ctxt,pxVar3,elem);
          if (iVar5 == 1) goto LAB_001835fb;
          ppxVar7 = &pxVar3->next;
        } while (-1 < iVar5);
      }
      else {
        if (pxVar2->type != XML_RELAXNG_EXCEPT) {
          return -1;
        }
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = ctxt->flags;
          ctxt->flags = uVar8 | 1;
        }
        ppxVar7 = &pxVar2->content;
        do {
          pxVar3 = *ppxVar7;
          if (pxVar3 == (xmlRelaxNGDefinePtr_conflict)0x0) {
LAB_001835fb:
            if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
              return 1;
            }
            ctxt->flags = uVar8;
            return 1;
          }
          iVar5 = xmlRelaxNGElementMatch(ctxt,pxVar3,elem);
          if (iVar5 == 1) {
            iVar4 = 0;
            break;
          }
          ppxVar7 = &pxVar3->next;
        } while (-1 < iVar5);
      }
      if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
        return iVar4;
      }
LAB_0018362b:
      ctxt->flags = uVar8;
      return iVar4;
    }
    arg1 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNONS;
  }
  pxVar6 = (xmlChar *)0x0;
LAB_00183580:
  xmlRelaxNGAddValidError(ctxt,err,arg1,pxVar6,0);
  return 0;
}

Assistant:

static int
xmlRelaxNGElementMatch(xmlRelaxNGValidCtxtPtr ctxt,
                       xmlRelaxNGDefinePtr define, xmlNodePtr elem)
{
    int ret = 0, oldflags = 0;

    if (define->name != NULL) {
        if (!xmlStrEqual(elem->name, define->name)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMNAME, define->name, elem->name);
            return (0);
        }
    }
    if ((define->ns != NULL) && (define->ns[0] != 0)) {
        if (elem->ns == NULL) {
            VALID_ERR2(XML_RELAXNG_ERR_ELEMNONS, elem->name);
            return (0);
        } else if (!xmlStrEqual(elem->ns->href, define->ns)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMWRONGNS,
                       elem->name, define->ns);
            return (0);
        }
    } else if ((elem->ns != NULL) && (define->ns != NULL) &&
               (define->name == NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, elem->name);
        return (0);
    } else if ((elem->ns != NULL) && (define->name != NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, define->name);
        return (0);
    }

    if (define->nameClass == NULL)
        return (1);

    define = define->nameClass;
    if (define->type == XML_RELAXNG_EXCEPT) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->content;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (0);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        ret = 1;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else if (define->type == XML_RELAXNG_CHOICE) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->nameClass;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (1);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        if (ctxt != NULL) {
            if (ret != 0) {
                if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                    xmlRelaxNGDumpValidError(ctxt);
            } else {
                if (ctxt->errNr > 0)
                    xmlRelaxNGPopErrors(ctxt, 0);
            }
        }
        ret = 0;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else {
        /* TODO */
        ret = -1;
    }
    return (ret);
}